

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

PassToken __thiscall
spvtools::CreateEliminateDeadOutputStoresPass
          (spvtools *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *live_locs,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *live_builtins)

{
  Pass *this_00;
  undefined8 *puVar1;
  
  this_00 = (Pass *)operator_new(0x60);
  opt::Pass::Pass(this_00);
  this_00->_vptr_Pass = (_func_int **)&PTR__EliminateDeadOutputStoresPass_00b1d7c0;
  this_00[1]._vptr_Pass = (_func_int **)live_locs;
  *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    **)&this_00[1].consumer_.super__Function_base._M_functor = live_builtins;
  *(undefined8 *)((long)&this_00[1].consumer_.super__Function_base._M_functor + 8) = 0;
  this_00[1].consumer_.super__Function_base._M_manager = (_Manager_type)0x0;
  this_00[1].consumer_._M_invoker = (_Invoker_type)0x0;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = this_00;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateEliminateDeadOutputStoresPass(
    std::unordered_set<uint32_t>* live_locs,
    std::unordered_set<uint32_t>* live_builtins) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::EliminateDeadOutputStoresPass>(live_locs, live_builtins));
}